

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

void __thiscall pbrt::Integrator::~Integrator(Integrator *this)

{
  pointer pLVar1;
  
  this->_vptr_Integrator = (_func_int **)&PTR__Integrator_0315d608;
  pLVar1 = (this->infiniteLights).
           super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pLVar1 != (pointer)0x0) {
    operator_delete(pLVar1,(long)(this->infiniteLights).
                                 super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pLVar1);
  }
  pLVar1 = (this->lights).super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pLVar1 != (pointer)0x0) {
    operator_delete(pLVar1,(long)(this->lights).
                                 super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pLVar1);
    return;
  }
  return;
}

Assistant:

Integrator::~Integrator() {}